

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

sh4asm_tok_mapping * check_tok(void)

{
  int iVar1;
  sh4asm_tok_mapping *local_18;
  sh4asm_tok_mapping *curs;
  
  local_18 = tok_map;
  while( true ) {
    if (local_18->txt == (char *)0x0) {
      return (sh4asm_tok_mapping *)0x0;
    }
    iVar1 = strcmp(cur_tok,local_18->txt);
    if (iVar1 == 0) break;
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

static struct sh4asm_tok_mapping const* check_tok(void) {
    struct sh4asm_tok_mapping const *curs = tok_map;

    while (curs->txt) {
        if (strcmp(cur_tok, curs->txt) == 0) {
            return curs;
        }
        curs++;
    }

    return NULL; // no token found
}